

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_test.cpp
# Opt level: O0

void flatbuffers::tests::NestedStructKeyInStructTest(void)

{
  Apple key;
  Apple key_00;
  Vector<const_keyfield::sample::Fruit_*,_unsigned_int> *pVVar1;
  uint8_t uVar2;
  size_t buffer_minalign;
  return_type pFVar3;
  span<float,_3UL> local_2c8;
  span<const_float,_3UL> local_2b8;
  Color local_2a8;
  Apple local_298;
  span<float,_3UL> local_280;
  span<const_float,_3UL> local_270;
  Color local_260;
  Apple local_250;
  Vector<const_keyfield::sample::Fruit_*,_unsigned_int> *local_238;
  Vector<const_keyfield::sample::Fruit_*,_unsigned_int> *sorted_fruit_vec;
  FooTable *foo_table;
  uint8_t *buf;
  uoffset_t local_218;
  Offset<keyfield::sample::FooTable> orc;
  undefined1 local_210 [8];
  FooTableBuilder foo_builder;
  Offset<flatbuffers::Vector<const_keyfield::sample::Fruit_*,_unsigned_int>_> fruits_vec;
  Offset<flatbuffers::String> test_string;
  span<const_float,_3UL> local_1e8;
  Color local_1d4;
  Apple local_1c4;
  Fruit local_1b0;
  span<float,_3UL> local_198;
  span<const_float,_3UL> local_188;
  Color local_178;
  Apple local_168;
  Fruit local_154;
  span<float,_3UL> local_130;
  span<const_float,_3UL> local_120;
  Color local_10c;
  Apple local_fc;
  Fruit local_e8;
  float local_d0 [2];
  float test_float_array3 [3];
  float test_float_array2 [3];
  float test_float_array1 [3];
  vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> fruits;
  FlatBufferBuilder fbb;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)
             &fruits.
              super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,
             buffer_minalign);
  std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::vector
            ((vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
             (test_float_array1 + 2));
  stack0xffffffffffffff50 = 0x402000003fc00000;
  test_float_array1[0] = 0.0;
  stack0xffffffffffffff40 = 0x402000003fc00000;
  test_float_array2[0] = 0.0;
  local_d0[0] = 1.5;
  local_d0[1] = 2.5;
  test_float_array3[0] = -1.0;
  make_span<float,3ul>((flatbuffers *)&local_130,(float (*) [3])(test_float_array2 + 2));
  span<const_float,_3UL>::span<float,_3UL,_0>(&local_120,&local_130);
  keyfield::sample::Color::Color(&local_10c,&local_120,'\x02');
  keyfield::sample::Apple::Apple(&local_fc,'\x02',&local_10c);
  keyfield::sample::Fruit::Fruit(&local_e8,&local_fc,'\x02');
  std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::push_back
            ((vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
             (test_float_array1 + 2),&local_e8);
  make_span<float,3ul>((flatbuffers *)&local_198,(float (*) [3])(test_float_array3 + 2));
  span<const_float,_3UL>::span<float,_3UL,_0>(&local_188,&local_198);
  keyfield::sample::Color::Color(&local_178,&local_188,'\x01');
  keyfield::sample::Apple::Apple(&local_168,'\x02',&local_178);
  keyfield::sample::Fruit::Fruit(&local_154,&local_168,'\x01');
  std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::push_back
            ((vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
             (test_float_array1 + 2),&local_154);
  make_span<float,3ul>((flatbuffers *)&fruits_vec,(float (*) [3])local_d0);
  span<const_float,_3UL>::span<float,_3UL,_0>(&local_1e8,(span<float,_3UL> *)&fruits_vec);
  keyfield::sample::Color::Color(&local_1d4,&local_1e8,'\x03');
  keyfield::sample::Apple::Apple(&local_1c4,'\x02',&local_1d4);
  keyfield::sample::Fruit::Fruit(&local_1b0,&local_1c4,'\x03');
  std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::push_back
            ((vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
             (test_float_array1 + 2),&local_1b0);
  foo_builder._12_4_ =
       FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                 ((FlatBufferBuilderImpl<false> *)
                  &fruits.
                   super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,"TEST");
  foo_builder.start_ =
       (uoffset_t)
       FlatBufferBuilderImpl<false>::
       CreateVectorOfSortedStructs<keyfield::sample::Fruit,std::allocator<keyfield::sample::Fruit>>
                 ((FlatBufferBuilderImpl<false> *)
                  &fruits.
                   super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
                  (test_float_array1 + 2));
  keyfield::sample::FooTableBuilder::FooTableBuilder
            ((FooTableBuilder *)local_210,
             (FlatBufferBuilder *)
             &fruits.
              super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  keyfield::sample::FooTableBuilder::add_a((FooTableBuilder *)local_210,1);
  orc.o = foo_builder._12_4_;
  keyfield::sample::FooTableBuilder::add_c
            ((FooTableBuilder *)local_210,(Offset<flatbuffers::String>)foo_builder._12_4_);
  local_218 = foo_builder.start_;
  keyfield::sample::FooTableBuilder::add_g
            ((FooTableBuilder *)local_210,
             (Offset<flatbuffers::Vector<const_keyfield::sample::Fruit_*,_unsigned_int>_>)
             foo_builder.start_);
  buf._0_4_ = keyfield::sample::FooTableBuilder::Finish((FooTableBuilder *)local_210);
  buf._4_4_ = buf._0_4_;
  FlatBufferBuilderImpl<false>::Finish<keyfield::sample::FooTable>
            ((FlatBufferBuilderImpl<false> *)
             &fruits.
              super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,buf._0_4_,(char *)0x0);
  foo_table = (FooTable *)
              FlatBufferBuilderImpl<false>::GetBufferPointer
                        ((FlatBufferBuilderImpl<false> *)
                         &fruits.
                          super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sorted_fruit_vec =
       (Vector<const_keyfield::sample::Fruit_*,_unsigned_int> *)
       keyfield::sample::GetFooTable(foo_table);
  local_238 = keyfield::sample::FooTable::g((FooTable *)sorted_fruit_vec);
  pFVar3 = Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::Get(local_238,0);
  uVar2 = keyfield::sample::Fruit::b(pFVar3);
  TestEq<unsigned_char,int>
            (uVar2,3,"\'sorted_fruit_vec->Get(0)->b()\' != \'3\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
             ,0x93,"");
  pFVar3 = Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::Get(local_238,1);
  uVar2 = keyfield::sample::Fruit::b(pFVar3);
  TestEq<unsigned_char,int>
            (uVar2,1,"\'sorted_fruit_vec->Get(1)->b()\' != \'1\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
             ,0x94,"");
  pFVar3 = Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::Get(local_238,2);
  uVar2 = keyfield::sample::Fruit::b(pFVar3);
  TestEq<unsigned_char,int>
            (uVar2,2,"\'sorted_fruit_vec->Get(2)->b()\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
             ,0x95,"");
  pVVar1 = local_238;
  make_span<float,3ul>((flatbuffers *)&local_280,(float (*) [3])(test_float_array3 + 2));
  span<const_float,_3UL>::span<float,_3UL,_0>(&local_270,&local_280);
  keyfield::sample::Color::Color(&local_260,&local_270,'\x01');
  keyfield::sample::Apple::Apple(&local_250,'\x02',&local_260);
  key.color_.rgb_[1] = local_250.color_.rgb_[1];
  key.color_.rgb_[2] = local_250.color_.rgb_[2];
  key.tag_ = local_250.tag_;
  key.padding0__ = local_250.padding0__;
  key.padding1__ = local_250.padding1__;
  key.color_.rgb_[0] = local_250.color_.rgb_[0];
  key.color_.tag_ = local_250.color_.tag_;
  key.color_.padding0__ = local_250.color_.padding0__;
  key.color_.padding1__ = local_250.color_.padding1__;
  pFVar3 = Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::
           LookupByKey<keyfield::sample::Apple>(pVVar1,key);
  uVar2 = keyfield::sample::Fruit::b(pFVar3);
  TestEq<unsigned_char,int>
            (uVar2,1,
             "\'sorted_fruit_vec ->LookupByKey( Apple(2, Color(flatbuffers::make_span(test_float_array2), 1))) ->b()\' != \'1\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
             ,0x9a,"");
  pVVar1 = local_238;
  make_span<float,3ul>((flatbuffers *)&local_2c8,(float (*) [3])(test_float_array3 + 2));
  span<const_float,_3UL>::span<float,_3UL,_0>(&local_2b8,&local_2c8);
  keyfield::sample::Color::Color(&local_2a8,&local_2b8,'\x01');
  keyfield::sample::Apple::Apple(&local_298,'\x01',&local_2a8);
  key_00.color_.rgb_[1] = local_298.color_.rgb_[1];
  key_00.color_.rgb_[2] = local_298.color_.rgb_[2];
  key_00.tag_ = local_298.tag_;
  key_00.padding0__ = local_298.padding0__;
  key_00.padding1__ = local_298.padding1__;
  key_00.color_.rgb_[0] = local_298.color_.rgb_[0];
  key_00.color_.tag_ = local_298.color_.tag_;
  key_00.color_.padding0__ = local_298.color_.padding0__;
  key_00.color_.padding1__ = local_298.color_.padding1__;
  pFVar3 = Vector<const_keyfield::sample::Fruit_*,_unsigned_int>::
           LookupByKey<keyfield::sample::Apple>(pVVar1,key_00);
  TestEq<keyfield::sample::Fruit_const*,keyfield::sample::Fruit_const*>
            (pFVar3,(Fruit *)0x0,
             "\'sorted_fruit_vec->LookupByKey( Apple(1, Color(flatbuffers::make_span(test_float_array2), 1)))\' != \'static_cast<const Fruit *>(nullptr)\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/key_field_test.cpp"
             ,0x9d,"");
  std::vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>::~vector
            ((vector<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_> *)
             (test_float_array1 + 2));
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)
             &fruits.
              super__Vector_base<keyfield::sample::Fruit,_std::allocator<keyfield::sample::Fruit>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void NestedStructKeyInStructTest() {
  flatbuffers::FlatBufferBuilder fbb;
  std::vector<Fruit> fruits;
  float test_float_array1[3] = { 1.5, 2.5, 0 };
  float test_float_array2[3] = { 1.5, 2.5, 0 };
  float test_float_array3[3] = { 1.5, 2.5, -1 };

  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array1), 2)), 2));
  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array2), 1)), 1));
  fruits.push_back(
      Fruit(Apple(2, Color(flatbuffers::make_span(test_float_array3), 3)), 3));

  auto test_string = fbb.CreateString("TEST");
  auto fruits_vec = fbb.CreateVectorOfSortedStructs(&fruits);

  FooTableBuilder foo_builder(fbb);
  foo_builder.add_a(1);
  foo_builder.add_c(test_string);
  foo_builder.add_g(fruits_vec);

  auto orc = foo_builder.Finish();
  fbb.Finish(orc);
  uint8_t *buf = fbb.GetBufferPointer();
  auto foo_table = GetFooTable(buf);

  auto sorted_fruit_vec = foo_table->g();
  TEST_EQ(sorted_fruit_vec->Get(0)->b(), 3);
  TEST_EQ(sorted_fruit_vec->Get(1)->b(), 1);
  TEST_EQ(sorted_fruit_vec->Get(2)->b(), 2);
  TEST_EQ(sorted_fruit_vec
              ->LookupByKey(
                  Apple(2, Color(flatbuffers::make_span(test_float_array2), 1)))
              ->b(),
          1);
  TEST_EQ(sorted_fruit_vec->LookupByKey(
              Apple(1, Color(flatbuffers::make_span(test_float_array2), 1))),
          static_cast<const Fruit *>(nullptr));
}